

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLeft3(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *eps,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec,int *idx,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *rhs,int *ridx,int rn,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs2,int *ridx2,int rn2,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec3,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs3,int *ridx3,int rn3)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint *puVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  uint *puVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  byte bVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  uint local_3b0 [28];
  int local_340;
  undefined1 local_33c;
  undefined8 local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar9 = 0;
  if ((this->l).updateType == 0) {
    puVar5 = (uint *)eps;
    puVar7 = local_b0;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = *puVar5;
      puVar5 = puVar5 + 1;
      puVar7 = puVar7 + 1;
    }
    local_40 = (eps->m_backend).exp;
    local_3c = (eps->m_backend).neg;
    local_38._0_4_ = (eps->m_backend).fpclass;
    local_38._4_4_ = (eps->m_backend).prec_elem;
    iVar1 = solveUpdateLeft(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_b0,rhs,ridx,rn);
    pnVar6 = eps;
    pnVar8 = &local_130;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = (eps->m_backend).exp;
    local_130.m_backend.neg = (eps->m_backend).neg;
    local_130.m_backend.fpclass = (eps->m_backend).fpclass;
    local_130.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar1 = solveUleft(this,&local_130,vec,idx,rhs,ridx,iVar1);
    lVar3 = 0x1c;
    pnVar6 = eps;
    pnVar8 = &local_1b0;
    for (lVar4 = lVar3; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (eps->m_backend).exp;
    local_1b0.m_backend.neg = (eps->m_backend).neg;
    local_1b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar2 = solveUpdateLeft(this,&local_1b0,rhs2,ridx2,rn2);
    pnVar6 = eps;
    pnVar8 = &local_230;
    for (lVar4 = lVar3; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = (eps->m_backend).exp;
    local_230.m_backend.neg = (eps->m_backend).neg;
    local_230.m_backend.fpclass = (eps->m_backend).fpclass;
    local_230.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_230,vec2,rhs2,ridx2,iVar2);
    pnVar6 = eps;
    pnVar8 = &local_2b0;
    for (; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = (eps->m_backend).exp;
    local_2b0.m_backend.neg = (eps->m_backend).neg;
    local_2b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_2b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar2 = solveUpdateLeft(this,&local_2b0,rhs3,ridx3,rn3);
    pnVar6 = eps;
    pnVar8 = &local_330;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = (eps->m_backend).exp;
    local_330.m_backend.neg = (eps->m_backend).neg;
    local_330.m_backend.fpclass = (eps->m_backend).fpclass;
    local_330.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_330,vec3,rhs3,ridx3,iVar2);
  }
  else {
    puVar5 = (uint *)eps;
    puVar7 = local_3b0;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = *puVar5;
      puVar5 = puVar5 + 1;
      puVar7 = puVar7 + 1;
    }
    local_340 = (eps->m_backend).exp;
    local_33c = (eps->m_backend).neg;
    local_338._0_4_ = (eps->m_backend).fpclass;
    local_338._4_4_ = (eps->m_backend).prec_elem;
    iVar1 = solveUleft(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_3b0,vec,idx,rhs,ridx,rn);
    pnVar6 = eps;
    pnVar8 = &local_430;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    local_430.m_backend.exp = (eps->m_backend).exp;
    local_430.m_backend.neg = (eps->m_backend).neg;
    local_430.m_backend.fpclass = (eps->m_backend).fpclass;
    local_430.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar1 = solveLleftForest(this,&local_430,vec,idx,iVar1);
    lVar3 = 0x1c;
    pnVar6 = eps;
    pnVar8 = &local_4b0;
    for (lVar4 = lVar3; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    local_4b0.m_backend.exp = (eps->m_backend).exp;
    local_4b0.m_backend.neg = (eps->m_backend).neg;
    local_4b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_4b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_4b0,vec2,rhs2,ridx2,rn2);
    solveLleftForestNoNZ(this,vec2);
    pnVar6 = eps;
    pnVar8 = &local_530;
    for (; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    local_530.m_backend.exp = (eps->m_backend).exp;
    local_530.m_backend.neg = (eps->m_backend).neg;
    local_530.m_backend.fpclass = (eps->m_backend).fpclass;
    local_530.m_backend.prec_elem = (eps->m_backend).prec_elem;
    solveUleftNoNZ(this,&local_530,vec3,rhs3,ridx3,rn3);
    solveLleftForestNoNZ(this,vec3);
  }
  pnVar6 = eps;
  pnVar8 = &local_5b0;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
    pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  local_5b0.m_backend.exp = (eps->m_backend).exp;
  local_5b0.m_backend.neg = (eps->m_backend).neg;
  local_5b0.m_backend.fpclass = (eps->m_backend).fpclass;
  local_5b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar1 = solveLleft(this,&local_5b0,vec,idx,iVar1);
  solveLleftNoNZ(this,vec2);
  solveLleftNoNZ(this,vec3);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft3(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2,          /* rhs2    */
                              R* vec3,                               /* result3 */
                              R* rhs3, int* ridx3, int rn3)          /* rhs3    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      rn3 = solveUpdateLeft(eps, rhs3, ridx3, rn3);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
      solveLleftForestNoNZ(vec3);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);
   solveLleftNoNZ(vec3);

   return rn;
}